

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::SetShadingRate
          (DeviceContextVkImpl *this,SHADING_RATE BaseRate,SHADING_RATE_COMBINER PrimitiveCombiner,
          SHADING_RATE_COMBINER TextureCombiner)

{
  element_type *peVar1;
  VkFragmentShadingRateCombinerOpKHR CombinerOps [2];
  string local_50;
  VkExtent2D local_30;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::SetShadingRate
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,BaseRate,PrimitiveCombiner,
             TextureCombiner,0);
  peVar1 = (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
           m_LogicalVkDevice).
           super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate == 0) {
    if ((peVar1->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap == 0) {
      FormatString<char[50]>(&local_50,(char (*) [50])0x7f0e3e);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                  (VkFragmentShadingRateCombinerOpKHR)local_50._M_dataplus._M_p),
                 "SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xfc0);
    }
    else {
      if (BaseRate != SHADING_RATE_1X1) {
        FormatString<char[66]>
                  (&local_50,
                   (char (*) [66])
                   "IDeviceContext::SetShadingRate: BaseRate must be SHADING_RATE_1X1");
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                    (VkFragmentShadingRateCombinerOpKHR)local_50._M_dataplus._M_p),
                   "SetShadingRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xfbb);
        std::__cxx11::string::~string((string *)&local_50);
      }
      if (PrimitiveCombiner != SHADING_RATE_COMBINER_PASSTHROUGH) {
        FormatString<char[92]>
                  (&local_50,
                   (char (*) [92])
                   "IDeviceContext::SetShadingRate: PrimitiveCombiner must be SHADING_RATE_COMBINER_PASSTHROUGH"
                  );
        DebugAssertionFailed
                  ((Char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                    (VkFragmentShadingRateCombinerOpKHR)local_50._M_dataplus._M_p),
                   "SetShadingRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xfbc);
        std::__cxx11::string::~string((string *)&local_50);
      }
      if (TextureCombiner == SHADING_RATE_COMBINER_OVERRIDE) {
        return;
      }
      FormatString<char[87]>
                (&local_50,
                 (char (*) [87])
                 "IDeviceContext::SetShadingRate: TextureCombiner must be SHADING_RATE_COMBINER_OVERRIDE"
                );
      DebugAssertionFailed
                ((Char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                  (VkFragmentShadingRateCombinerOpKHR)local_50._M_dataplus._M_p),
                 "SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xfbd);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    local_50._M_dataplus._M_p._0_4_ =
         ShadingRateCombinerToVkFragmentShadingRateCombinerOp(PrimitiveCombiner);
    local_50._M_dataplus._M_p._4_4_ =
         ShadingRateCombinerToVkFragmentShadingRateCombinerOp(TextureCombiner);
    EnsureVkCmdBuffer(this);
    local_30 = ShadingRateToVkFragmentSize(BaseRate);
    VulkanUtilities::VulkanCommandBuffer::SetFragmentShadingRate
              (&this->m_CommandBuffer,&local_30,(VkFragmentShadingRateCombinerOpKHR *)&local_50);
    (this->m_State).ShadingRateIsSet = true;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetShadingRate(SHADING_RATE BaseRate, SHADING_RATE_COMBINER PrimitiveCombiner, SHADING_RATE_COMBINER TextureCombiner)
{
    TDeviceContextBase::SetShadingRate(BaseRate, PrimitiveCombiner, TextureCombiner, 0);

    const auto& ExtFeatures = m_pDevice->GetLogicalDevice().GetEnabledExtFeatures();
    if (ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
    {
        const VkFragmentShadingRateCombinerOpKHR CombinerOps[2] =
            {
                ShadingRateCombinerToVkFragmentShadingRateCombinerOp(PrimitiveCombiner),
                ShadingRateCombinerToVkFragmentShadingRateCombinerOp(TextureCombiner) //
            };

        EnsureVkCmdBuffer();
        m_CommandBuffer.SetFragmentShadingRate(ShadingRateToVkFragmentSize(BaseRate), CombinerOps);
        m_State.ShadingRateIsSet = true;
    }
    else if (ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)
    {
        // Ignored
        DEV_CHECK_ERR(BaseRate == SHADING_RATE_1X1, "IDeviceContext::SetShadingRate: BaseRate must be SHADING_RATE_1X1");
        DEV_CHECK_ERR(PrimitiveCombiner == SHADING_RATE_COMBINER_PASSTHROUGH, "IDeviceContext::SetShadingRate: PrimitiveCombiner must be SHADING_RATE_COMBINER_PASSTHROUGH");
        DEV_CHECK_ERR(TextureCombiner == SHADING_RATE_COMBINER_OVERRIDE, "IDeviceContext::SetShadingRate: TextureCombiner must be SHADING_RATE_COMBINER_OVERRIDE");
    }
    else
        UNEXPECTED("VariableRateShading device feature is not enabled");
}